

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# path.c
# Opt level: O3

_Bool al_make_path_canonical(ALLEGRO_PATH *path)

{
  _AL_VECTOR *vec;
  ulong uVar1;
  undefined8 *puVar2;
  char *pcVar3;
  size_t sVar4;
  uint idx;
  
  if ((path->segments)._size != 0) {
    vec = &path->segments;
    idx = 0;
    do {
      puVar2 = (undefined8 *)_al_vector_ref(vec,idx);
      pcVar3 = al_cstr((ALLEGRO_USTR *)*puVar2);
      if ((*pcVar3 == '.') && (pcVar3[1] == '\0')) {
        al_remove_path_component(path,idx);
      }
      else {
        idx = idx + 1;
      }
      uVar1 = (path->segments)._size;
    } while (idx < uVar1);
    if (uVar1 != 0) {
      puVar2 = (undefined8 *)_al_vector_ref(vec,0);
      sVar4 = al_ustr_size((ALLEGRO_USTR *)*puVar2);
      if (sVar4 == 0) {
        uVar1 = (path->segments)._size;
        while (1 < uVar1) {
          puVar2 = (undefined8 *)_al_vector_ref(vec,1);
          pcVar3 = al_cstr((ALLEGRO_USTR *)*puVar2);
          if (*pcVar3 != '.') {
            return true;
          }
          if (pcVar3[1] != '.') {
            return true;
          }
          if (pcVar3[2] != '\0') {
            return true;
          }
          al_remove_path_component(path,1);
          uVar1 = (path->segments)._size;
        }
      }
    }
  }
  return true;
}

Assistant:

bool al_make_path_canonical(ALLEGRO_PATH *path)
{
   unsigned i;
   ASSERT(path);

   for (i = 0; i < _al_vector_size(&path->segments); ) {
      if (strcmp(get_segment_cstr(path, i), ".") == 0)
         al_remove_path_component(path, i);
      else
         i++;
   }

   /* Remove leading '..'s on absolute paths. */
   if (_al_vector_size(&path->segments) >= 1 &&
      al_ustr_size(get_segment(path, 0)) == 0)
   {
      while (_al_vector_size(&path->segments) >= 2 &&
         strcmp(get_segment_cstr(path, 1), "..") == 0)
      {
         al_remove_path_component(path, 1);
      }
   }

   return true;
}